

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O1

void __thiscall
FIX::SocketMonitor::processRead(SocketMonitor *this,Strategy *strategy,socket_handle socket_fd)

{
  uint in_EAX;
  socket_handle socket;
  undefined8 uStack_18;
  
  if (this->m_interrupt == socket_fd) {
    uStack_18 = (ulong)in_EAX;
    recv(socket_fd,(void *)((long)&uStack_18 + 4),4,0);
    addWrite(this,uStack_18._4_4_);
    return;
  }
  (*strategy->_vptr_Strategy[3])(strategy,this,socket_fd,strategy->_vptr_Strategy[3]);
  return;
}

Assistant:

void SocketMonitor::processRead(Strategy &strategy, socket_handle socket_fd) {
  int s = socket_fd;
  if (s == m_interrupt) {
    socket_handle socket = 0;
    recv(s, (char *)&socket, sizeof(socket), 0);
    addWrite(socket);
  } else {
    strategy.onEvent(*this, s);
  }
}